

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int bstrListDestroy(bstrList *sl)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = -1;
  if ((sl != (bstrList *)0x0) && (iVar2 = sl->qty, iVar1 = -1, -1 < iVar2)) {
    for (lVar3 = 0; lVar3 < iVar2; lVar3 = lVar3 + 1) {
      if (sl->entry[lVar3] != (bstring)0x0) {
        bdestroy(sl->entry[lVar3]);
        sl->entry[lVar3] = (bstring)0x0;
        iVar2 = sl->qty;
      }
    }
    sl->qty = -1;
    sl->mlen = -1;
    free(sl->entry);
    free(sl);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int bstrListDestroy (struct bstrList * sl) {
int i;
	if (sl == NULL || sl->qty < 0) return BSTR_ERR;
	for (i=0; i < sl->qty; i++) {
		if (sl->entry[i]) {
			bdestroy (sl->entry[i]);
			sl->entry[i] = NULL;
		}
	}
	sl->qty  = -1;
	sl->mlen = -1;
	bstr__free (sl->entry);
	sl->entry = NULL;
	bstr__free (sl);
	return BSTR_OK;
}